

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O0

int32 ngram_model_set_raw_score
                (ngram_model_t *base,int32 wid,int32 *history,int32 n_hist,int32 *n_used)

{
  int iVar1;
  logmath_t *lmath;
  int32 iVar2;
  int local_4c;
  int local_48;
  int32 j_1;
  int32 j;
  int32 i;
  int32 score;
  int32 mapwid;
  ngram_model_set_t *set;
  int32 *n_used_local;
  int32 n_hist_local;
  int32 *history_local;
  int32 wid_local;
  ngram_model_t *base_local;
  
  n_used_local._4_4_ = n_hist;
  if ((int)(base->n - 1) < n_hist) {
    n_used_local._4_4_ = base->n - 1;
  }
  if (*(int *)&base[1].field_0x4 == -1) {
    j = base->log_zero;
    for (j_1 = 0; j_1 < base[1].refcount; j_1 = j_1 + 1) {
      iVar2 = *(int32 *)((long)(&((base[1].lmath)->t).table)[wid] + (long)j_1 * 4);
      for (local_48 = 0; local_48 < n_used_local._4_4_; local_48 = local_48 + 1) {
        if (history[local_48] == -1) {
          *(undefined4 *)(*(long *)&base[1].lw + (long)local_48 * 4) = 0xffffffff;
        }
        else {
          *(undefined4 *)(*(long *)&base[1].lw + (long)local_48 * 4) =
               *(undefined4 *)
                ((long)(&((base[1].lmath)->t).table)[history[local_48]] + (long)j_1 * 4);
        }
      }
      lmath = base->lmath;
      iVar1 = *(int *)(*(long *)&base[1].n + (long)j_1 * 4);
      iVar2 = ngram_ng_prob(*(ngram_model_t **)(base[1].n_counts + (long)j_1 * 2),iVar2,
                            *(int32 **)&base[1].lw,n_used_local._4_4_,n_used);
      j = logmath_add(lmath,j,iVar1 + iVar2);
    }
  }
  else {
    iVar2 = *(int32 *)((long)(&((base[1].lmath)->t).table)[wid] +
                      (long)*(int *)&base[1].field_0x4 * 4);
    for (local_4c = 0; local_4c < n_used_local._4_4_; local_4c = local_4c + 1) {
      if (history[local_4c] == -1) {
        *(undefined4 *)(*(long *)&base[1].lw + (long)local_4c * 4) = 0xffffffff;
      }
      else {
        *(undefined4 *)(*(long *)&base[1].lw + (long)local_4c * 4) =
             *(undefined4 *)
              ((long)(&((base[1].lmath)->t).table)[history[local_4c]] +
              (long)*(int *)&base[1].field_0x4 * 4);
      }
    }
    j = ngram_ng_prob(*(ngram_model_t **)(base[1].n_counts + (long)*(int *)&base[1].field_0x4 * 2),
                      iVar2,*(int32 **)&base[1].lw,n_used_local._4_4_,n_used);
  }
  return j;
}

Assistant:

static int32
ngram_model_set_raw_score(ngram_model_t * base, int32 wid,
                          int32 * history, int32 n_hist, int32 * n_used)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 mapwid;
    int32 score;
    int32 i;

    /* Truncate the history. */
    if (n_hist > base->n - 1)
        n_hist = base->n - 1;

    /* Interpolate if there is no current. */
    if (set->cur == -1) {
        score = base->log_zero;
        for (i = 0; i < set->n_models; ++i) {
            int32 j;
            /* Map word and history IDs for each model. */
            mapwid = set->widmap[wid][i];
            for (j = 0; j < n_hist; ++j) {
                if (history[j] == NGRAM_INVALID_WID)
                    set->maphist[j] = NGRAM_INVALID_WID;
                else
                    set->maphist[j] = set->widmap[history[j]][i];
            }
            score = logmath_add(base->lmath, score,
                                set->lweights[i] +
                                ngram_ng_prob(set->lms[i],
                                              mapwid, set->maphist, n_hist,
                                              n_used));
        }
    }
    else {
        int32 j;
        /* Map word and history IDs (FIXME: do this in a function?) */
        mapwid = set->widmap[wid][set->cur];
        for (j = 0; j < n_hist; ++j) {
            if (history[j] == NGRAM_INVALID_WID)
                set->maphist[j] = NGRAM_INVALID_WID;
            else
                set->maphist[j] = set->widmap[history[j]][set->cur];
        }
        score = ngram_ng_prob(set->lms[set->cur],
                              mapwid, set->maphist, n_hist, n_used);
    }

    return score;
}